

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsEnableRuntimeExecution(JsRuntimeHandle runtimeHandle)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JsErrorCode JVar4;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    this = *runtimeHandle;
    bVar2 = ThreadContext::TestThreadContextFlag(this,ThreadContextFlagCanDisableExecution);
    JVar4 = JsNoError;
    if (bVar2) {
      if (this->recycler != (Recycler *)0x0) {
        bVar2 = Memory::Recycler::IsHeapEnumInProgress(this->recycler);
        JVar4 = JsErrorHeapEnumInProgress;
        if (bVar2) goto LAB_003837b6;
      }
      JVar4 = JsErrorInThreadServiceCallback;
      if ((this->threadService).isInCallback == false) {
        ThreadContextScope::ThreadContextScope
                  ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,this);
        JVar4 = JsErrorWrongThread;
        if (anon_var_0.m_staticAbortMessage._1_1_ == '\x01') {
          JVar4 = JsNoError;
          ThreadContext::EnableExecution(this);
        }
        ThreadContextScope::~ThreadContextScope
                  ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
      }
    }
  }
LAB_003837b6:
  if ((JVar4 - JsErrorNoCurrentContext < 7) &&
     ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar4;
}

Assistant:

CHAKRA_API JsEnableRuntimeExecution(_In_ JsRuntimeHandle runtimeHandle)
{
    return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        if (!threadContext->TestThreadContextFlag(ThreadContextFlagCanDisableExecution))
        {
            return JsNoError;
        }

        if (threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (threadContext->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        threadContext->EnableExecution();
        return JsNoError;
    });
}